

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse3CachedPCRE(int iters,char *regexp,StringPiece *text)

{
  undefined8 text_00;
  bool bVar1;
  string *__lhs;
  ostream *poVar2;
  LogMessage local_3e8;
  Arg local_268;
  Arg local_258;
  Arg local_248;
  int local_234;
  undefined1 local_230 [4];
  int i;
  StringPiece sp3;
  StringPiece sp2;
  StringPiece sp1;
  undefined1 local_70 [8];
  PCRE re;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  re._72_8_ = text;
  PCRE::PCRE((PCRE *)local_70,regexp,EnabledCompileOptions);
  __lhs = PCRE::error_abi_cxx11_((PCRE *)local_70);
  bVar1 = std::operator==(__lhs,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&sp1.length_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x494);
    poVar2 = LogMessage::stream((LogMessage *)&sp1.length_);
    std::operator<<(poVar2,"Check failed: (re.error()) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&sp1.length_);
  }
  StringPiece::StringPiece((StringPiece *)&sp2.length_);
  StringPiece::StringPiece((StringPiece *)&sp3.length_);
  StringPiece::StringPiece((StringPiece *)local_230);
  for (local_234 = 0; text_00 = re._72_8_, local_234 < iters; local_234 = local_234 + 1) {
    PCRE::Arg::Arg(&local_248,(StringPiece *)&sp2.length_);
    PCRE::Arg::Arg(&local_258,(StringPiece *)&sp3.length_);
    PCRE::Arg::Arg(&local_268,(StringPiece *)local_230);
    bVar1 = PCRE::FullMatchFunctor::operator()
                      ((FullMatchFunctor *)&PCRE::FullMatch,(StringPiece *)text_00,(PCRE *)local_70,
                       &local_248,&local_258,&local_268,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_3e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x497);
      poVar2 = LogMessage::stream(&local_3e8);
      std::operator<<(poVar2,"Check failed: PCRE::FullMatch(text, re, &sp1, &sp2, &sp3)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3e8);
    }
  }
  PCRE::~PCRE((PCRE *)local_70);
  return;
}

Assistant:

void Parse3CachedPCRE(int iters, const char* regexp, const StringPiece& text) {
  PCRE re(regexp, PCRE::UTF8);
  CHECK_EQ(re.error(), "");
  StringPiece sp1, sp2, sp3;
  for (int i = 0; i < iters; i++) {
    CHECK(PCRE::FullMatch(text, re, &sp1, &sp2, &sp3));
  }
}